

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackScriptFunction.cpp
# Opt level: O3

FrameDisplay * __thiscall
Js::StackScriptFunction::BoxState::BoxFrameDisplay(BoxState *this,FrameDisplay *frameDisplay)

{
  ushort uVar1;
  ushort uVar2;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  Recycler *this_00;
  undefined4 *puVar6;
  FrameDisplay *slotArray;
  uint index;
  undefined1 local_80 [8];
  TrackAllocData data;
  FrameDisplay *local_48;
  FrameDisplay *boxedFrameDisplay;
  FrameDisplay *frameDisplay_local;
  
  boxedFrameDisplay = frameDisplay;
  if (frameDisplay == (FrameDisplay *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/StackScriptFunction.cpp"
                                ,0x264,"(frameDisplay != nullptr)","frameDisplay != nullptr");
    if (!bVar4) goto LAB_00d4f1cb;
    *puVar6 = 0;
  }
  else if (frameDisplay == (FrameDisplay *)&NullFrameDisplay) {
    return (FrameDisplay *)&NullFrameDisplay;
  }
  local_48 = (FrameDisplay *)0x0;
  bVar4 = JsUtil::
          BaseDictionary<void*,void*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetValue<Js::FrameDisplay*>
                    ((BaseDictionary<void*,void*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)&this->boxedValues,&boxedFrameDisplay,&local_48);
  if (!bVar4) {
    uVar1 = boxedFrameDisplay->length;
    bVar4 = ThreadContext::IsOnStack(boxedFrameDisplay);
    data._32_8_ = boxedFrameDisplay;
    uVar2 = uVar1;
    if (bVar4) {
      local_80 = (undefined1  [8])&FrameDisplay::typeinfo;
      data.plusSize = 0xffffffffffffffff;
      data.count = (size_t)anon_var_dwarf_8fb6a9e;
      data.filename._0_4_ = 0x278;
      data.typeinfo = (type_info *)(ulong)((uint)uVar1 * 8);
      frameDisplay_local._6_2_ = uVar1;
      this_00 = Memory::Recycler::TrackAllocInfo
                          (this->scriptContext->recycler,(TrackAllocData *)local_80);
      BVar5 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar5 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x207,"(ExceptionCheck::CanHandleOutOfMemory())",
                                    "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar4) goto LAB_00d4f1cb;
        *puVar6 = 0;
      }
      data._32_8_ = Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)256,false>
                              (this_00,(size_t)((type_info *)(ulong)((uint)uVar1 * 8) + 8));
      uVar2 = frameDisplay_local._6_2_;
      if ((FrameDisplay *)data._32_8_ == (FrameDisplay *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar6 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x20d,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar4) {
LAB_00d4f1cb:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar6 = 0;
      }
      ((FrameDisplay *)data._32_8_)->tag = true;
      ((FrameDisplay *)data._32_8_)->strictMode = false;
      ((FrameDisplay *)data._32_8_)->length = uVar2;
      ((FrameDisplay *)data._32_8_)->unused = 0;
    }
    local_80 = (undefined1  [8])boxedFrameDisplay;
    local_48 = (FrameDisplay *)data._32_8_;
    JsUtil::
    BaseDictionary<void*,void*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
    ::
    Insert<(JsUtil::BaseDictionary<void*,void*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
              ((BaseDictionary<void*,void*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                *)&this->boxedValues,(void **)local_80,(void **)&data.line);
    if (uVar2 != 0) {
      index = 0;
      do {
        slotArray = (FrameDisplay *)FrameDisplay::GetItem(boxedFrameDisplay,index);
        if (slotArray == (FrameDisplay *)0x0) {
          slotArray = (FrameDisplay *)0x0;
        }
        else if ((ulong)*slotArray < 0x10000) {
          Memory::Recycler::WBSetBit(local_80);
          local_80 = (undefined1  [8])slotArray;
          Memory::RecyclerWriteBarrierManager::WriteBarrier(local_80);
          slotArray = (FrameDisplay *)BoxScopeSlots(this,(Type *)slotArray,*(uint *)local_80);
        }
        FrameDisplay::SetItem(local_48,index,slotArray);
        FrameDisplay::SetItem(boxedFrameDisplay,index,slotArray);
        index = index + 1;
      } while (uVar1 != index);
    }
  }
  return local_48;
}

Assistant:

FrameDisplay * StackScriptFunction::BoxState::BoxFrameDisplay(FrameDisplay * frameDisplay)
    {
        Assert(frameDisplay != nullptr);
        if (frameDisplay == &Js::NullFrameDisplay)
        {
            return frameDisplay;
        }

        FrameDisplay * boxedFrameDisplay = nullptr;
        if (boxedValues.TryGetValue(frameDisplay, (void **)&boxedFrameDisplay))
        {
            return boxedFrameDisplay;
        }

        // Create new frame display when we allocate the frame display on the stack
        uint16 length = frameDisplay->GetLength();
        if (!ThreadContext::IsOnStack(frameDisplay))
        {
            boxedFrameDisplay = frameDisplay;
        }
        else
        {
            boxedFrameDisplay = RecyclerNewPlus(scriptContext->GetRecycler(), length * sizeof(Var), FrameDisplay, length);
        }
        boxedValues.Add(frameDisplay, boxedFrameDisplay);

        for (uint16 i = 0; i < length; i++)
        {
            // TODO: Once we allocate the slots on the stack, we can only look those slots
            Field(Var) * pScope = (Field(Var) *)frameDisplay->GetItem(i);
            // We don't do stack slots if we exceed max encoded slot count
            if (ScopeSlots::Is(pScope))
            {
                pScope = BoxScopeSlots(pScope, static_cast<uint>(ScopeSlots(pScope).GetCount()));
            }
            boxedFrameDisplay->SetItem(i, pScope);
            frameDisplay->SetItem(i, pScope);
        }
        return boxedFrameDisplay;
    }